

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void http2_data_done(Curl_cfilter *cf,Curl_easy *data,_Bool premature)

{
  uint stream_id;
  long *plVar1;
  nghttp2_session *session;
  bool bVar2;
  _Bool _Var3;
  size_t size;
  uint *local_40;
  _Bool flush_egress;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  _Bool premature_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_40 = (uint *)0x0;
  }
  else {
    local_40 = (uint *)((data->req).p.http)->h2_ctx;
  }
  if (local_40 != (uint *)0x0) {
    if (*plVar1 != 0) {
      bVar2 = false;
      nghttp2_session_set_stream_user_data((nghttp2_session *)*plVar1,*local_40,(void *)0x0);
      if (((*(byte *)((long)local_40 + 0x14d) & 1) == 0) && (0 < (int)*local_40)) {
        if ((data != (Curl_easy *)0x0) &&
           ((((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 && (cf != (Curl_cfilter *)0x0))
            && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"[%d] premature DATA_DONE, RST stream",(ulong)*local_40);
        }
        *(undefined1 *)((long)local_40 + 0x14d) = 1;
        *(undefined1 *)((long)local_40 + 0x14e) = 1;
        *(undefined1 *)((long)local_40 + 0x151) = 1;
        nghttp2_submit_rst_stream((nghttp2_session *)*plVar1,'\0',*local_40,5);
        bVar2 = true;
      }
      _Var3 = Curl_bufq_is_empty((bufq *)(local_40 + 2));
      if (!_Var3) {
        session = (nghttp2_session *)*plVar1;
        stream_id = *local_40;
        size = Curl_bufq_len((bufq *)(local_40 + 2));
        nghttp2_session_consume(session,stream_id,size);
        bVar2 = true;
      }
      if (bVar2) {
        nghttp2_session_send((nghttp2_session *)*plVar1);
      }
    }
    Curl_bufq_free((bufq *)(local_40 + 0x12));
    Curl_bufq_free((bufq *)(local_40 + 2));
    Curl_h1_req_parse_free((h1_req_parser *)(local_40 + 0x22));
    Curl_dynhds_free((dynhds *)(local_40 + 0x36));
    if (*(long *)(local_40 + 0x4a) != 0) {
      while (*(long *)(local_40 + 0x4c) != 0) {
        (*Curl_cfree)(*(void **)(*(long *)(local_40 + 0x4a) + (*(long *)(local_40 + 0x4c) + -1) * 8)
                     );
        *(long *)(local_40 + 0x4c) = *(long *)(local_40 + 0x4c) + -1;
      }
      (*Curl_cfree)(*(void **)(local_40 + 0x4a));
      local_40[0x4a] = 0;
      local_40[0x4b] = 0;
    }
    (*Curl_cfree)(local_40);
    ((data->req).p.http)->h2_ctx = (void *)0x0;
  }
  return;
}

Assistant:

static void http2_data_done(struct Curl_cfilter *cf,
                            struct Curl_easy *data, bool premature)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  DEBUGASSERT(ctx);
  (void)premature;
  if(!stream)
    return;

  if(ctx->h2) {
    bool flush_egress = FALSE;
    /* returns error if stream not known, which is fine here */
    (void)nghttp2_session_set_stream_user_data(ctx->h2, stream->id, NULL);

    if(!stream->closed && stream->id > 0) {
      /* RST_STREAM */
      CURL_TRC_CF(data, cf, "[%d] premature DATA_DONE, RST stream",
                  stream->id);
      stream->closed = TRUE;
      stream->reset = TRUE;
      stream->send_closed = TRUE;
      nghttp2_submit_rst_stream(ctx->h2, NGHTTP2_FLAG_NONE,
                                stream->id, NGHTTP2_STREAM_CLOSED);
      flush_egress = TRUE;
    }
    if(!Curl_bufq_is_empty(&stream->recvbuf)) {
      /* Anything in the recvbuf is still being counted
       * in stream and connection window flow control. Need
       * to free that space or the connection window might get
       * exhausted eventually. */
      nghttp2_session_consume(ctx->h2, stream->id,
                              Curl_bufq_len(&stream->recvbuf));
      /* give WINDOW_UPATE a chance to be sent, but ignore any error */
      flush_egress = TRUE;
    }

    if(flush_egress)
      nghttp2_session_send(ctx->h2);
  }

  Curl_bufq_free(&stream->sendbuf);
  Curl_bufq_free(&stream->recvbuf);
  Curl_h1_req_parse_free(&stream->h1);
  Curl_dynhds_free(&stream->resp_trailers);
  if(stream->push_headers) {
    /* if they weren't used and then freed before */
    for(; stream->push_headers_used > 0; --stream->push_headers_used) {
      free(stream->push_headers[stream->push_headers_used - 1]);
    }
    free(stream->push_headers);
    stream->push_headers = NULL;
  }

  free(stream);
  H2_STREAM_LCTX(data) = NULL;
}